

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_editor.c
# Opt level: O0

void canvas_clearline(_glist *x)

{
  _glist *x_local;
  
  if (((byte)x->gl_editor->field_0x88 >> 5 & 1) != 0) {
    canvas_disconnect_with_undo
              (x,(float)x->gl_editor->e_selectline_index1,(float)x->gl_editor->e_selectline_outno,
               (float)x->gl_editor->e_selectline_index2,(float)x->gl_editor->e_selectline_inno);
    x->gl_editor->field_0x88 = x->gl_editor->field_0x88 & 0xdf;
    canvas_dirty(x,1.0);
  }
  return;
}

Assistant:

static void canvas_clearline(t_canvas *x)
{
    if (x->gl_editor->e_selectedline)
    {
        canvas_disconnect_with_undo(x,
            x->gl_editor->e_selectline_index1,
            x->gl_editor->e_selectline_outno,
            x->gl_editor->e_selectline_index2,
            x->gl_editor->e_selectline_inno);
        x->gl_editor->e_selectedline = 0;
        canvas_dirty(x, 1);
    }
}